

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::~Cast(Cast *this)

{
  Cast *this_local;
  
  std::
  variant<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
  ::~variant(&this->state);
  return;
}

Assistant:

Breaking(Flow breaking) : Flow(breaking) {}